

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::
dispatcher_template_t<so_5::disp::prio_one_thread::reuse::work_thread_template_t<so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t,_so_5::disp::prio_one_thread::reuse::work_thread_details::no_activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_priority
          (disp_data_source_t *this,mbox_t *mbox,priority_t priority,size_t quote,
          size_t agents_count,size_t demands_count)

{
  intrusive_ptr_t<so_5::abstract_message_box_t> *piVar1;
  char *pcVar2;
  ostream *poVar3;
  size_t sVar4;
  suffix_t local_228;
  suffix_t local_220;
  suffix_t local_218;
  string local_210 [36];
  undefined1 local_1ec [8];
  prefix_t prefix;
  ostringstream local_1b0 [8];
  ostringstream ss;
  size_t local_38;
  size_t demands_count_local;
  size_t agents_count_local;
  size_t quote_local;
  mbox_t *pmStack_18;
  priority_t priority_local;
  mbox_t *mbox_local;
  disp_data_source_t *this_local;
  
  local_38 = demands_count;
  demands_count_local = agents_count;
  agents_count_local = quote;
  quote_local._7_1_ = priority;
  pmStack_18 = mbox;
  mbox_local = (mbox_t *)this;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  pcVar2 = stats::prefix_t::c_str(&this->m_base_prefix);
  poVar3 = std::operator<<((ostream *)local_1b0,pcVar2);
  poVar3 = std::operator<<(poVar3,"/p");
  sVar4 = to_size_t(quote_local._7_1_);
  std::ostream::operator<<(poVar3,sVar4);
  std::__cxx11::ostringstream::str();
  stats::prefix_t::prefix_t((prefix_t *)local_1ec,local_210);
  std::__cxx11::string::~string((string *)local_210);
  piVar1 = pmStack_18;
  local_218 = stats::suffixes::demand_quote();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (piVar1,(prefix_t *)local_1ec,&local_218,&agents_count_local);
  piVar1 = pmStack_18;
  local_220 = stats::suffixes::agent_count();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (piVar1,(prefix_t *)local_1ec,&local_220,&demands_count_local);
  piVar1 = pmStack_18;
  local_228 = stats::suffixes::work_thread_queue_size();
  send<so_5::stats::messages::quantity<unsigned_long>,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&,so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (piVar1,(prefix_t *)local_1ec,&local_228,&local_38);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void
				distribute_value_for_priority(
					const mbox_t & mbox,
					priority_t priority,
					std::size_t quote,
					std::size_t agents_count,
					std::size_t demands_count )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/p" << to_size_t(priority);

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::demand_quote(),
								quote );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								agents_count );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								demands_count );
					}